

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O3

Int __thiscall
ipx::LpSolver::GetBasicSolution
          (LpSolver *this,double *x,double *slack,double *y,double *z,Int *cbasis,Int *vbasis)

{
  if ((this->basic_statuses_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->basic_statuses_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    Model::PostsolveBasicSolution
              (&this->model_,&this->x_crossover_,&this->y_crossover_,&this->z_crossover_,
               &this->basic_statuses_,x,slack,y,z);
    Model::PostsolveBasis(&this->model_,&this->basic_statuses_,cbasis,vbasis);
    return 0;
  }
  return -1;
}

Assistant:

Int LpSolver::GetBasicSolution(double* x, double* slack, double* y, double* z,
                               Int* cbasis, Int* vbasis) const {
    if (basic_statuses_.empty())
        return -1;
    model_.PostsolveBasicSolution(x_crossover_, y_crossover_, z_crossover_,
                                  basic_statuses_, x, slack, y, z);
    model_.PostsolveBasis(basic_statuses_, cbasis, vbasis);
    return 0;
}